

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

_Bool sesschan_run_subsystem(Channel *chan,ptrlen subsys)

{
  _Bool _Var1;
  SftpServer *pSVar2;
  sesschan *sess;
  Channel *chan_local;
  ptrlen subsys_local;
  
  _Var1 = ptrlen_eq_string(subsys,"sftp");
  if ((_Var1) && (*(long *)&chan[-0x5c].initial_fixed_window_size != 0)) {
    pSVar2 = sftpsrv_new(*(SftpServerVtable **)&chan[-0x5c].initial_fixed_window_size);
    *(SftpServer **)&chan[-2].initial_fixed_window_size = pSVar2;
    chan->vt = &sftp_channelvt;
    logevent((LogContext *)chan[-0x5d].vt,"Starting built-in SFTP subsystem");
    subsys_local.len._7_1_ = true;
  }
  else {
    subsys_local.len._7_1_ = false;
  }
  return subsys_local.len._7_1_;
}

Assistant:

bool sesschan_run_subsystem(Channel *chan, ptrlen subsys)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    if (ptrlen_eq_string(subsys, "sftp") && sess->sftpserver_vt) {
        sess->sftpsrv = sftpsrv_new(sess->sftpserver_vt);
        sess->chan.vt = &sftp_channelvt;
        logevent(sess->parent_logctx, "Starting built-in SFTP subsystem");
        return true;
    }

    return false;
}